

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

void __thiscall draco::PlyElement::PlyElement(PlyElement *this,string *name,int64_t num_entries)

{
  _Rb_tree_header *p_Var1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->num_entries_ = num_entries;
  (this->properties_).super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->properties_).super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->properties_).super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->property_index_)._M_t._M_impl.super__Rb_tree_header;
  (this->property_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->property_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->property_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->property_index_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->property_index_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

PlyElement::PlyElement(const std::string &name, int64_t num_entries)
    : name_(name), num_entries_(num_entries) {}